

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::resize
          (mipmapped_texture *this,uint new_width,uint new_height,resample_params *params)

{
  uint size;
  bool bVar1;
  mip_level *pmVar2;
  image_u8 *src;
  image_u8 *dst;
  uint f_1;
  long lVar3;
  ulong uVar4;
  uint l;
  ulong uVar5;
  image_u8 *p;
  uint f;
  ulong uVar6;
  bool bVar7;
  face_vec faces;
  resample_params local_90;
  image_u8 tmp;
  
  size = (this->m_faces).m_size;
  if (size == 0) {
    bVar7 = false;
  }
  else {
    vector<crnlib::vector<crnlib::mip_level_*>_>::vector(&faces,size);
    lVar3 = 0;
    for (uVar6 = 0; uVar6 < faces.m_size; uVar6 = uVar6 + 1) {
      vector<crnlib::mip_level_*>::resize
                ((vector<crnlib::mip_level_*> *)((long)&(faces.m_p)->m_p + lVar3),1,false);
      pmVar2 = crnlib_new<crnlib::mip_level>();
      **(undefined8 **)((long)&(faces.m_p)->m_p + lVar3) = pmVar2;
      lVar3 = lVar3 + 0x10;
    }
    uVar6 = 0;
    do {
      bVar7 = faces.m_size <= uVar6;
      if (bVar7) {
        assign(this,&faces);
        break;
      }
      tmp.m_width = 0;
      tmp.m_height = 0;
      tmp.m_pitch = 0;
      tmp.m_total = 0;
      tmp.m_comp_flags = 0xf;
      tmp.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
      tmp.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
      tmp.m_pixel_buf.m_size = 0;
      tmp.m_pixel_buf.m_capacity = 0;
      pmVar2 = *(this->m_faces).m_p[uVar6].m_p;
      src = mip_level::get_unpacked_image(pmVar2,&tmp,1);
      dst = (image_u8 *)
            crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)pmVar2);
      local_90.m_filter_scale = params->m_filter_scale;
      local_90.m_first_comp = 0;
      local_90.m_source_gamma = 2.2;
      local_90.m_num_comps = 4 - ((src->m_comp_flags & 8) == 0);
      local_90.m_wrapping = params->m_wrapping;
      local_90.m_srgb = params->m_srgb;
      local_90.m_pFilter = params->m_pFilter;
      local_90.m_multithreaded = params->m_multithreaded;
      p = dst;
      local_90.m_dst_width = new_width;
      local_90.m_dst_height = new_height;
      bVar1 = image_utils::resample(src,dst,&local_90);
      if (bVar1) {
        if (params->m_renormalize == true) {
          image_utils::renorm_normal_map(dst);
        }
        dst->m_comp_flags = src->m_comp_flags;
        mip_level::assign(*faces.m_p[uVar6].m_p,dst,PIXEL_FMT_INVALID,
                          (*(this->m_faces).m_p[uVar6].m_p)->m_orient_flags);
      }
      else {
        crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)dst,p);
        for (uVar4 = 0; uVar4 < faces.m_size; uVar4 = uVar4 + 1) {
          for (uVar5 = 0; uVar5 < faces.m_p[uVar4].m_size; uVar5 = uVar5 + 1) {
            crnlib_delete<crnlib::mip_level>(faces.m_p[uVar4].m_p[uVar5]);
          }
        }
      }
      vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&tmp.m_pixel_buf);
      uVar6 = uVar6 + 1;
    } while (bVar1);
    vector<crnlib::vector<crnlib::mip_level_*>_>::~vector(&faces);
  }
  return bVar7;
}

Assistant:

bool mipmapped_texture::resize(uint new_width, uint new_height, const resample_params& params) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  CRNLIB_ASSERT((new_width >= 1) && (new_height >= 1));

  face_vec faces(get_num_faces());
  for (uint f = 0; f < faces.size(); f++) {
    faces[f].resize(1);
    faces[f][0] = crnlib_new<mip_level>();
  }

  for (uint f = 0; f < faces.size(); f++) {
    image_u8 tmp;
    image_u8* pImg = get_level(f, 0)->get_unpacked_image(tmp, cUnpackFlagUncook);

    image_u8* pMip = crnlib_new<image_u8>();

    image_utils::resample_params rparams;
    rparams.m_dst_width = new_width;
    rparams.m_dst_height = new_height;
    rparams.m_filter_scale = params.m_filter_scale;
    rparams.m_first_comp = 0;
    rparams.m_num_comps = pImg->is_component_valid(3) ? 4 : 3;
    rparams.m_srgb = params.m_srgb;
    rparams.m_wrapping = params.m_wrapping;
    rparams.m_pFilter = params.m_pFilter;
    rparams.m_multithreaded = params.m_multithreaded;

    if (!image_utils::resample(*pImg, *pMip, rparams)) {
      crnlib_delete(pMip);

      for (uint f = 0; f < faces.size(); f++)
        for (uint l = 0; l < faces[f].size(); l++)
          crnlib_delete(faces[f][l]);

      return false;
    }

    if (params.m_renormalize)
      image_utils::renorm_normal_map(*pMip);

    pMip->set_comp_flags(pImg->get_comp_flags());

    faces[f][0]->assign(pMip, PIXEL_FMT_INVALID, get_level(f, 0)->get_orientation_flags());
  }

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}